

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

bool commandLineOffChooseOnOk(HighsLogOptions *report_log_options,string *name,string *value)

{
  size_t __n;
  _Alloc_hider _Var1;
  int iVar2;
  pointer __s1;
  
  __n = value->_M_string_length;
  if (__n == kHighsOffString_abi_cxx11_._M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar2 = bcmp((value->_M_dataplus)._M_p,kHighsOffString_abi_cxx11_._M_dataplus._M_p,__n);
    if (iVar2 == 0) {
      return true;
    }
  }
  if (__n == kHighsChooseString_abi_cxx11_._M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar2 = bcmp((value->_M_dataplus)._M_p,kHighsChooseString_abi_cxx11_._M_dataplus._M_p,__n);
    if (iVar2 == 0) {
      return true;
    }
  }
  _Var1._M_p = kHighsOnString_abi_cxx11_._M_dataplus._M_p;
  if (__n == kHighsOnString_abi_cxx11_._M_string_length) {
    if (__n == 0) {
      return true;
    }
    __s1 = (value->_M_dataplus)._M_p;
    iVar2 = bcmp(__s1,kHighsOnString_abi_cxx11_._M_dataplus._M_p,__n);
    if (iVar2 == 0) {
      return true;
    }
  }
  else {
    __s1 = (value->_M_dataplus)._M_p;
  }
  highsLogUser(report_log_options,kWarning,
               "Value \"%s\" for %s option is not one of \"%s\", \"%s\" or \"%s\"\n",__s1,
               (name->_M_dataplus)._M_p,kHighsOffString_abi_cxx11_._M_dataplus._M_p,
               kHighsChooseString_abi_cxx11_._M_dataplus._M_p,_Var1._M_p);
  return false;
}

Assistant:

bool commandLineOffChooseOnOk(const HighsLogOptions& report_log_options,
                              const string& name, const string& value) {
  if (value == kHighsOffString || value == kHighsChooseString ||
      value == kHighsOnString)
    return true;
  highsLogUser(
      report_log_options, HighsLogType::kWarning,
      "Value \"%s\" for %s option is not one of \"%s\", \"%s\" or \"%s\"\n",
      value.c_str(), name.c_str(), kHighsOffString.c_str(),
      kHighsChooseString.c_str(), kHighsOnString.c_str());
  return false;
}